

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamHttp::Seek(BamHttp *this,int64_t *position,int origin)

{
  bool bVar1;
  ulong uVar2;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  TcpSocket *in_stack_fffffffffffffea8;
  BamHttp *in_stack_fffffffffffffeb0;
  allocator *paVar3;
  allocator local_111;
  string local_110 [24];
  BamHttp *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  IBamIODevice *in_stack_ffffffffffffff20;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  long *local_18;
  bool local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  uVar2 = (**(code **)(*in_RDI + 0x50))();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamHttp::Seek",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"cannot seek on unopen connection",&local_79);
    IBamIODevice::SetErrorString
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_1 = false;
  }
  else {
    DisconnectSocket(in_stack_fffffffffffffeb0);
    bVar1 = ConnectSocket(in_stack_ffffffffffffff08);
    if (bVar1) {
      if (local_1c == 0) {
        in_RDI[0x16] = *local_18;
      }
      else {
        if (local_1c != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffff18,"BamHttp::Seek",
                     (allocator *)&stack0xffffffffffffff17);
          paVar3 = &local_111;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_110,"unsupported seek origin",paVar3);
          IBamIODevice::SetErrorString
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
          return false;
        }
        in_RDI[0x16] = *local_18 + in_RDI[0x16];
      }
      local_1 = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"BamHttp::Seek",&local_a1);
      TcpSocket::GetErrorString_abi_cxx11_(in_stack_fffffffffffffea8);
      IBamIODevice::SetErrorString
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool BamHttp::Seek(const int64_t& position, const int origin)
{

    // if HTTP device not in a valid state
    if (!IsOpen()) {
        SetErrorString("BamHttp::Seek", "cannot seek on unopen connection");
        return false;
    }

    // reset the connection
    DisconnectSocket();
    if (!ConnectSocket()) {
        SetErrorString("BamHttp::Seek", m_socket->GetErrorString());
        return false;
    }

    // udpate file position
    switch (origin) {
        case SEEK_CUR:
            m_filePosition += position;
            break;
        case SEEK_SET:
            m_filePosition = position;
            break;
        default:
            SetErrorString("BamHttp::Seek", "unsupported seek origin");
            return false;
    }

    // return success
    return true;
}